

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

void crnlib::pack_etc1_block_init(void)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int color;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  ulong local_60;
  
  local_60 = 0;
  bVar3 = true;
  do {
    lVar5 = 0;
    do {
      lVar8 = 0;
      do {
        iVar1 = (&g_etc1_inten_tables)[lVar5 * 4 + lVar8];
        uVar12 = 0;
        do {
          uVar13 = 0xffffffff;
          uVar10 = 0;
          uVar7 = 0;
          uVar4 = 0;
          uVar9 = 1;
          do {
            uVar11 = uVar9 - 1;
            if (bVar3) {
              uVar6 = uVar10 | uVar11;
            }
            else {
              uVar6 = uVar11 >> 2 | uVar7;
            }
            uVar6 = uVar6 + iVar1;
            if (0xfe < (int)uVar6) {
              uVar6 = 0xff;
            }
            if ((int)uVar6 < 1) {
              uVar6 = 0;
            }
            uVar14 = uVar6 - (int)uVar12;
            uVar2 = -uVar14;
            if (0 < (int)uVar14) {
              uVar2 = uVar14;
            }
            bVar15 = uVar2 < uVar13;
            if (bVar15) {
              uVar4 = uVar11;
              uVar13 = uVar2;
            }
            if (uVar12 == uVar6 && bVar15) break;
            uVar7 = uVar7 + 8;
            uVar10 = uVar10 + 0x10;
            bVar15 = uVar9 < (uint)(byte)~bVar3 * 0x10 + 0x10;
            uVar9 = uVar9 + 1;
          } while (bVar15);
          *(ushort *)
           (g_etc1_inverse_lookup + uVar12 * 2 + (lVar8 * 0x10 + lVar5 * 2 | local_60) * 0x200) =
               (ushort)uVar4 | (ushort)(uVar13 << 8);
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0x100);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    local_60 = 1;
    bVar15 = !bVar3;
    bVar3 = false;
    if (bVar15) {
      return;
    }
  } while( true );
}

Assistant:

void pack_etc1_block_init() {
  for (uint diff = 0; diff < 2; diff++) {
    const uint limit = diff ? 32 : 16;

    for (uint inten = 0; inten < 8; inten++) {
      for (uint selector = 0; selector < 4; selector++) {
        const uint inverse_table_index = diff + (inten << 1) + (selector << 4);
        for (int color = 0; color < 256; color++) {
          uint best_error = cUINT32_MAX, best_packed_c = 0;
          for (uint packed_c = 0; packed_c < limit; packed_c++) {
            int v = etc1_decode_value(diff, inten, selector, packed_c);
            uint err = labs(v - color);
            if (err < best_error) {
              best_error = err;
              best_packed_c = packed_c;
              if (!best_error)
                break;
            }
          }
          CRNLIB_ASSERT(best_error <= 255);
          g_etc1_inverse_lookup[inverse_table_index][color] = static_cast<uint16>(best_packed_c | (best_error << 8));
        }
      }
    }
  }
}